

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASTVisitor.h
# Opt level: O0

void __thiscall
slang::ast::ASTVisitor<cast_signed_index::MainVisitor,_true,_true,_false,_false>::
visit<slang::ast::ContinueStatement>
          (ASTVisitor<cast_signed_index::MainVisitor,_true,_true,_false,_false> *this,
          ContinueStatement *t)

{
  bool bVar1;
  Statement *in_RSI;
  ASTVisitor<cast_signed_index::MainVisitor,_true,_true,_false,_false> *in_RDI;
  
  bVar1 = Statement::bad(in_RSI);
  if (!bVar1) {
    visitDefault<slang::ast::ContinueStatement>(in_RDI,(ContinueStatement *)in_RSI);
  }
  return;
}

Assistant:

void visit(const T& t) {
        if constexpr (!VisitBad && requires { t.bad(); }) {
            if (t.bad())
                return;
        }

        if constexpr (requires { (DERIVED).handle(t); })
            (DERIVED).handle(t);
        else if constexpr (requires { (DERIVED)(DERIVED, t); })
            (DERIVED)(DERIVED, t);
        else
            visitDefault(t);
    }